

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# play-full.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  size_type sVar1;
  char *__nptr;
  int iVar2;
  uint uVar3;
  mapped_type *pmVar4;
  int *piVar5;
  ulong uVar6;
  undefined8 uVar7;
  uint uVar8;
  ulong uVar9;
  SDL_AudioSpec playbackSpec;
  SDL_AudioSpec obtainedSpec;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  argm;
  ifstream fin;
  undefined4 local_2c8;
  undefined2 uStack_2c4;
  undefined1 uStack_2c2;
  undefined1 uStack_2c1;
  undefined2 local_2c0;
  code *local_2b8;
  key_type *local_2b0;
  key_type local_2a8;
  uint local_288;
  ushort local_284;
  byte local_282;
  ushort local_280;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_268;
  key_type local_238;
  int aiStack_218 [122];
  
  printf("Usage: %s input.kbd [-pN]\n",*argv);
  puts("    -pN - select playback device N");
  putchar(10);
  iVar2 = -0x7f;
  if (1 < argc) {
    parseCmdArguments_abi_cxx11_
              ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)&local_268,argc,argv);
    local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_238,"p","");
    pmVar4 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)&local_268,&local_238);
    sVar1 = pmVar4->_M_string_length;
    if (sVar1 == 0) {
      uVar6 = 0;
    }
    else {
      local_2a8._M_dataplus._M_p = (pointer)&local_2a8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_2a8,"p","");
      pmVar4 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)&local_268,&local_2a8);
      __nptr = (pmVar4->_M_dataplus)._M_p;
      piVar5 = __errno_location();
      iVar2 = *piVar5;
      *piVar5 = 0;
      uVar6 = strtol(__nptr,(char **)&local_2c8,10);
      if ((char *)CONCAT17(uStack_2c1,CONCAT16(uStack_2c2,CONCAT24(uStack_2c4,local_2c8))) == __nptr
         ) {
        std::__throw_invalid_argument("stoi");
LAB_0010e573:
        uVar7 = std::__throw_out_of_range("stoi");
        std::ifstream::~ifstream(&local_238);
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::~_Rb_tree(&local_268);
        _Unwind_Resume(uVar7);
      }
      if (((long)(int)uVar6 != uVar6) || (*piVar5 == 0x22)) goto LAB_0010e573;
      if (*piVar5 == 0) {
        *piVar5 = iVar2;
      }
    }
    if ((sVar1 != 0) &&
       ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2a8._M_dataplus._M_p != &local_2a8.field_2)) {
      operator_delete(local_2a8._M_dataplus._M_p,local_2a8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_238._M_dataplus._M_p != &local_238.field_2) {
      operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
    }
    std::ifstream::ifstream(&local_238,argv[1],_S_bin);
    if (*(int *)((long)aiStack_218 + *(long *)(local_238._M_dataplus._M_p + -0x18)) == 0) {
      iVar2 = SDL_Init(0x10);
      if (iVar2 < 0) {
        uVar7 = SDL_GetError();
        iVar2 = -1;
        SDL_LogError(0,"Couldn\'t initialize SDL: %s\n",uVar7);
      }
      else {
        uVar3 = SDL_GetNumAudioDevices(0);
        printf("Found %d playback devices:\n",(ulong)uVar3);
        if (0 < (int)uVar3) {
          uVar9 = 0;
          do {
            uVar7 = SDL_GetAudioDeviceName(uVar9,0);
            printf("    - Playback device #%d: \'%s\'\n",uVar9,uVar7);
            uVar8 = (int)uVar9 + 1;
            uVar9 = (ulong)uVar8;
          } while (uVar3 != uVar8);
        }
        SDL_memset(&local_2c8,0,0x20);
        local_2c8 = 16000;
        uStack_2c4 = 0x8120;
        uStack_2c2 = 1;
        local_2c0 = 0x200;
        local_2b8 = cbPlayback;
        local_2b0 = &local_238;
        SDL_memset(&local_288,0,0x20);
        uVar7 = SDL_GetAudioDeviceName(uVar6 & 0xffffffff,0);
        printf("Attempt to open playback device %d : \'%s\' ...\n",uVar6 & 0xffffffff,uVar7);
        uVar7 = SDL_GetAudioDeviceName(uVar6 & 0xffffffff,0);
        iVar2 = SDL_OpenAudioDevice(uVar7,0,&local_2c8,&local_288,4);
        if (iVar2 == 0) {
          uVar7 = SDL_GetError();
          SDL_LogError(0,"Couldn\'t open an audio device for playback: %s!\n",uVar7);
          iVar2 = -2;
          SDL_Quit();
        }
        else {
          puts("Opened playback device succesfully!");
          printf("    Frequency:  %d\n",(ulong)local_288);
          printf("    Format:     %d (%d bytes)\n",(ulong)local_284,4);
          printf("    Channels:   %d\n",(ulong)local_282);
          printf("    Samples:    %d\n",(ulong)local_280);
          SDL_PauseAudioDevice(iVar2,0);
          while (g_terminate == false) {
            SDL_Delay(100);
          }
          std::ifstream::close();
          iVar2 = 0;
          SDL_CloseAudio();
        }
      }
    }
    else {
      main_cold_1();
      iVar2 = -1;
    }
    std::ifstream::~ifstream(&local_238);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree(&local_268);
  }
  return iVar2;
}

Assistant:

int main(int argc, char ** argv) {
    printf("Usage: %s input.kbd [-pN]\n", argv[0]);
    printf("    -pN - select playback device N\n");
    printf("\n");

    if (argc < 2) {
        return -127;
    }

    auto argm = parseCmdArguments(argc, argv);
    int playbackId = argm["p"].empty() ? 0 : std::stoi(argm["p"]);

    std::ifstream fin(argv[1], std::ios::binary);
    if (fin.good() == false) {
        fprintf(stderr, "Failed to open file '%s'\n", argv[1]);
        return -1;
    }

    if (SDL_Init(SDL_INIT_AUDIO) < 0) {
        SDL_LogError(SDL_LOG_CATEGORY_APPLICATION, "Couldn't initialize SDL: %s\n", SDL_GetError());
        return -1;
    }

    int nDevices = SDL_GetNumAudioDevices(SDL_FALSE);
    printf("Found %d playback devices:\n", nDevices);
    for (int i = 0; i < nDevices; i++) {
        printf("    - Playback device #%d: '%s'\n", i, SDL_GetAudioDeviceName(i, SDL_FALSE));
    }

    SDL_AudioSpec playbackSpec;
    SDL_zero(playbackSpec);

    playbackSpec.freq = kSampleRate;
    playbackSpec.format = AUDIO_F32SYS;
    playbackSpec.channels = 1;
    playbackSpec.samples = kSamplesPerFrame;
    playbackSpec.callback = cbPlayback;
    playbackSpec.userdata = (void *)(&fin);

    SDL_AudioSpec obtainedSpec;
    SDL_zero(obtainedSpec);

    printf("Attempt to open playback device %d : '%s' ...\n", playbackId, SDL_GetAudioDeviceName(playbackId, SDL_FALSE));
    auto deviceIdOut = SDL_OpenAudioDevice(SDL_GetAudioDeviceName(playbackId, SDL_FALSE), SDL_FALSE, &playbackSpec, &obtainedSpec, SDL_AUDIO_ALLOW_CHANNELS_CHANGE);
    if (!deviceIdOut) {
        SDL_LogError(SDL_LOG_CATEGORY_APPLICATION, "Couldn't open an audio device for playback: %s!\n", SDL_GetError());
        SDL_Quit();
        return -2;
    }

    int sampleSize_bytes = 4; // todo

    printf("Opened playback device succesfully!\n");
    printf("    Frequency:  %d\n", obtainedSpec.freq);
    printf("    Format:     %d (%d bytes)\n", obtainedSpec.format, sampleSize_bytes);
    printf("    Channels:   %d\n", obtainedSpec.channels);
    printf("    Samples:    %d\n", obtainedSpec.samples);

    SDL_PauseAudioDevice(deviceIdOut, 0);

    while (g_terminate == false) {
        SDL_Delay(100);
    }

    fin.close();

    SDL_CloseAudio();

    return 0;
}